

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::addCombinedMemory(MultiMemoryLowering *this)

{
  bool bVar1;
  pointer pMVar2;
  Name name;
  Type local_40;
  bool local_38 [8];
  Address local_30;
  char *local_28;
  Address local_20;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_18;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  MultiMemoryLowering *this_local;
  
  local_28 = (char *)(this->combinedMemory).super_IString.str._M_len;
  local_20.addr = (address64_t)(this->combinedMemory).super_IString.str._M_str;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)this;
  wasm::Address::Address(&local_30,0);
  wasm::Address::Address((Address *)local_38,0x10000);
  wasm::Type::Type(&local_40,i32);
  name.super_IString.str._M_str = local_28;
  name.super_IString.str._M_len = (size_t)&local_18;
  Builder::makeMemory(name,local_20,local_30,local_38[0],(Type)0x0);
  bVar1 = this->isShared;
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_18);
  pMVar2->shared = (bool)(bVar1 & 1);
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_18);
  (pMVar2->indexType).id = (this->pointerType).id;
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_18);
  (pMVar2->initial).addr = (this->totalInitialPages).addr;
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(&local_18);
  (pMVar2->max).addr = (this->totalMaxPages).addr;
  if ((this->isImported & 1U) != 0) {
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_18);
    wasm::Name::operator=(&(pMVar2->super_Importable).base,&this->base);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_18);
    wasm::Name::operator=(&(pMVar2->super_Importable).module,&this->module);
  }
  Module::addMemory(this->wasm,&local_18);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void addCombinedMemory() {
    auto memory = Builder::makeMemory(combinedMemory);
    memory->shared = isShared;
    memory->indexType = pointerType;
    memory->initial = totalInitialPages;
    memory->max = totalMaxPages;
    if (isImported) {
      memory->base = base;
      memory->module = module;
    }
    wasm->addMemory(std::move(memory));
  }